

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O3

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
               (vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                *container)

{
  pointer ppMVar1;
  __normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  temp;
  pointer ppMVar2;
  
  if (container !=
      (vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> *)0x0) {
    ppMVar2 = (container->
              super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppMVar1 = (container->
              super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar2 != ppMVar1) {
      do {
        if (*ppMVar2 != (Message *)0x0) {
          (*((*ppMVar2)->super_MessageLite)._vptr_MessageLite[1])();
        }
        ppMVar2 = ppMVar2 + 1;
      } while (ppMVar2 != ppMVar1);
      ppMVar2 = (container->
                super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((container->
          super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppMVar2) {
        (container->
        super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppMVar2;
      }
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}